

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O0

void Imf_2_5::optimizedWriteToRGB
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **writePtr,size_t *pixelsToCopySSE,
               size_t *pixelsToCopyNormal)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  unsigned_short **in_RCX;
  unsigned_short **in_RDX;
  unsigned_short **in_RSI;
  unsigned_short **in_RDI;
  size_t *in_R9;
  bool writePtrIsAligned;
  bool readPtrAreAligned;
  size_t *in_stack_00000088;
  __m128i **in_stack_00000090;
  __m128i **in_stack_00000098;
  __m128i **in_stack_000000a0;
  __m128i **in_stack_000000a8;
  
  bVar2 = isPointerSSEAligned(*in_RDI);
  bVar3 = isPointerSSEAligned(*in_RSI);
  bVar4 = isPointerSSEAligned(*in_RDX);
  bVar1 = (bVar2 && bVar3) && bVar4;
  bVar5 = isPointerSSEAligned(*in_RCX);
  if ((bVar1) || (bVar5)) {
    if ((bVar1) || (!bVar5)) {
      if (((!bVar2 || !bVar3) || !bVar4) || (bVar5)) {
        if (((bVar2 && bVar3) && bVar4) && (bVar5)) {
          writeToRGBSSETemplate<true,true>
                    (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                     in_stack_00000088);
        }
      }
      else {
        writeToRGBSSETemplate<true,false>
                  (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                   in_stack_00000088);
      }
    }
    else {
      writeToRGBSSETemplate<false,true>
                (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                 in_stack_00000088);
    }
  }
  else {
    writeToRGBSSETemplate<false,false>
              (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
               in_stack_00000088);
  }
  writeToRGBNormal(in_RDI,in_RSI,in_RDX,in_RCX,in_R9);
  return;
}

Assistant:

EXR_FORCEINLINE 
void optimizedWriteToRGB (unsigned short*& readPtrRed,
                          unsigned short*& readPtrGreen,
                          unsigned short*& readPtrBlue,
                          unsigned short*& writePtr,
                          const size_t& pixelsToCopySSE,
                          const size_t& pixelsToCopyNormal)
{
    bool readPtrAreAligned = true;

    readPtrAreAligned &= isPointerSSEAligned(readPtrRed);
    readPtrAreAligned &= isPointerSSEAligned(readPtrGreen);
    readPtrAreAligned &= isPointerSSEAligned(readPtrBlue);

    bool writePtrIsAligned = isPointerSSEAligned(writePtr);

    if (!readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, false> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if (!readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, true> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, false> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, true> ((__m128i*&)readPtrRed,
                                           (__m128i*&)readPtrGreen,
                                           (__m128i*&)readPtrBlue,
                                           (__m128i*&)writePtr,
                                           pixelsToCopySSE);
    }


    writeToRGBNormal (readPtrRed, readPtrGreen, readPtrBlue,
                      writePtr, pixelsToCopyNormal);
}